

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O2

void xmlXPtrEvalRangePredicate(xmlXPathParserContextPtr ctxt)

{
  byte bVar1;
  int *piVar2;
  xmlXPathContextPtr pxVar3;
  xmlChar *pxVar4;
  xmlNodePtr val;
  int iVar5;
  byte *pbVar6;
  xmlXPathObjectPtr pxVar7;
  xmlLocationSetPtr val_00;
  xmlXPathObjectPtr pxVar8;
  xmlXPathObjectPtr res;
  xmlXPathObjectPtr val_01;
  byte *pbVar9;
  long lVar10;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  pbVar9 = ctxt->cur;
  while( true ) {
    pbVar6 = pbVar9 + 1;
    bVar1 = *pbVar9;
    if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
    ctxt->cur = pbVar6;
    pbVar9 = pbVar6;
  }
  if (bVar1 == 0x5b) {
    while( true ) {
      ctxt->cur = pbVar6;
      if ((0x20 < (ulong)*pbVar6) || ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) == 0)) break;
      pbVar6 = pbVar6 + 1;
    }
    iVar5 = 0xb;
    if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_LOCATIONSET))
    goto LAB_001e25de;
    pxVar7 = valuePop(ctxt);
    piVar2 = (int *)pxVar7->user;
    pxVar3 = ctxt->context;
    pxVar3->node = (xmlNodePtr)0x0;
    if ((piVar2 == (int *)0x0) || (*piVar2 == 0)) {
      pxVar3->contextSize = 0;
      pxVar3->proximityPosition = 0;
      xmlXPathEvalExpr(ctxt);
      pxVar8 = valuePop(ctxt);
      if (pxVar8 != (xmlXPathObjectPtr)0x0) {
        xmlXPathFreeObject(pxVar8);
      }
      valuePush(ctxt,pxVar7);
      if (ctxt->error != 0) {
        return;
      }
    }
    else {
      pxVar4 = ctxt->cur;
      val_00 = xmlXPtrLocationSetCreate((xmlXPathObjectPtr)0x0);
      for (lVar10 = 0; lVar10 < *piVar2; lVar10 = lVar10 + 1) {
        ctxt->cur = pxVar4;
        val = *(xmlNodePtr *)(*(long *)(*(long *)(piVar2 + 2) + lVar10 * 8) + 0x28);
        ctxt->context->node = val;
        pxVar8 = xmlXPathNewNodeSet(val);
        valuePush(ctxt,pxVar8);
        pxVar3 = ctxt->context;
        pxVar3->contextSize = *piVar2;
        pxVar3->proximityPosition = (int)lVar10 + 1;
        xmlXPathEvalExpr(ctxt);
        if (ctxt->error != 0) {
          return;
        }
        res = valuePop(ctxt);
        iVar5 = xmlXPathEvaluatePredicateResult(ctxt,res);
        if (iVar5 != 0) {
          val_01 = xmlXPathObjectCopy(*(xmlXPathObjectPtr *)(*(long *)(piVar2 + 2) + lVar10 * 8));
          xmlXPtrLocationSetAdd(val_00,val_01);
        }
        if (res != (xmlXPathObjectPtr)0x0) {
          xmlXPathFreeObject(res);
        }
        if (ctxt->value == pxVar8) {
          pxVar8 = valuePop(ctxt);
          xmlXPathFreeObject(pxVar8);
        }
        ctxt->context->node = (xmlNodePtr)0x0;
      }
      xmlXPathFreeObject(pxVar7);
      pxVar3 = ctxt->context;
      pxVar3->node = (xmlNodePtr)0x0;
      pxVar3->contextSize = -1;
      pxVar3->proximityPosition = -1;
      pxVar7 = xmlXPtrWrapLocationSet(val_00);
      valuePush(ctxt,pxVar7);
    }
    pbVar9 = ctxt->cur;
    if (*pbVar9 == 0x5d) {
      do {
        pbVar9 = pbVar9 + 1;
        ctxt->cur = pbVar9;
        if (0x20 < (ulong)*pbVar9) {
          return;
        }
      } while ((0x100002600U >> ((ulong)*pbVar9 & 0x3f) & 1) != 0);
      return;
    }
  }
  iVar5 = 6;
LAB_001e25de:
  xmlXPathErr(ctxt,iVar5);
  return;
}

Assistant:

void
xmlXPtrEvalRangePredicate(xmlXPathParserContextPtr ctxt) {
    const xmlChar *cur;
    xmlXPathObjectPtr res;
    xmlXPathObjectPtr obj, tmp;
    xmlLocationSetPtr newset = NULL;
    xmlLocationSetPtr oldset;
    int i;

    if (ctxt == NULL) return;

    SKIP_BLANKS;
    if (CUR != '[') {
	XP_ERROR(XPATH_INVALID_PREDICATE_ERROR);
    }
    NEXT;
    SKIP_BLANKS;

    /*
     * Extract the old set, and then evaluate the result of the
     * expression for all the element in the set. use it to grow
     * up a new set.
     */
    CHECK_TYPE(XPATH_LOCATIONSET);
    obj = valuePop(ctxt);
    oldset = obj->user;
    ctxt->context->node = NULL;

    if ((oldset == NULL) || (oldset->locNr == 0)) {
	ctxt->context->contextSize = 0;
	ctxt->context->proximityPosition = 0;
	xmlXPathEvalExpr(ctxt);
	res = valuePop(ctxt);
	if (res != NULL)
	    xmlXPathFreeObject(res);
	valuePush(ctxt, obj);
	CHECK_ERROR;
    } else {
	/*
	 * Save the expression pointer since we will have to evaluate
	 * it multiple times. Initialize the new set.
	 */
        cur = ctxt->cur;
	newset = xmlXPtrLocationSetCreate(NULL);

        for (i = 0; i < oldset->locNr; i++) {
	    ctxt->cur = cur;

	    /*
	     * Run the evaluation with a node list made of a single item
	     * in the nodeset.
	     */
	    ctxt->context->node = oldset->locTab[i]->user;
	    tmp = xmlXPathNewNodeSet(ctxt->context->node);
	    valuePush(ctxt, tmp);
	    ctxt->context->contextSize = oldset->locNr;
	    ctxt->context->proximityPosition = i + 1;

	    xmlXPathEvalExpr(ctxt);
	    CHECK_ERROR;

	    /*
	     * The result of the evaluation need to be tested to
	     * decided whether the filter succeeded or not
	     */
	    res = valuePop(ctxt);
	    if (xmlXPathEvaluatePredicateResult(ctxt, res)) {
	        xmlXPtrLocationSetAdd(newset,
			xmlXPathObjectCopy(oldset->locTab[i]));
	    }

	    /*
	     * Cleanup
	     */
	    if (res != NULL)
		xmlXPathFreeObject(res);
	    if (ctxt->value == tmp) {
		res = valuePop(ctxt);
		xmlXPathFreeObject(res);
	    }

	    ctxt->context->node = NULL;
	}

	/*
	 * The result is used as the new evaluation set.
	 */
	xmlXPathFreeObject(obj);
	ctxt->context->node = NULL;
	ctxt->context->contextSize = -1;
	ctxt->context->proximityPosition = -1;
	valuePush(ctxt, xmlXPtrWrapLocationSet(newset));
    }
    if (CUR != ']') {
	XP_ERROR(XPATH_INVALID_PREDICATE_ERROR);
    }

    NEXT;
    SKIP_BLANKS;
}